

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O1

void __thiscall pg::TSPMSolver::run(TSPMSolver *this)

{
  uint64_t *puVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  int *__s;
  int *__s_00;
  int *piVar7;
  int *piVar8;
  ostream *poVar9;
  Game *pGVar10;
  Error *this_00;
  ulong uVar11;
  long lVar12;
  int from;
  int iVar13;
  char *pcVar14;
  uint uVar15;
  int from_1;
  long lVar16;
  
  pGVar10 = (this->super_Solver).game;
  lVar12 = pGVar10->n_vertices;
  uVar15 = *(uint *)((long)pGVar10->_priority + ((lVar12 << 0x20) + -0x100000000 >> 0x1e));
  iVar13 = 2;
  if (0 < (int)uVar15) {
    iVar13 = uVar15 + 1;
  }
  lVar16 = (long)iVar13;
  this->k = lVar16;
  uVar5 = lVar12 * lVar16;
  piVar6 = (int *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | uVar5 * 4);
  this->pms = piVar6;
  __s = (int *)operator_new__(-(ulong)((ulong)pGVar10->n_vertices >> 0x3e != 0) |
                              pGVar10->n_vertices << 2);
  this->strategy = __s;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar13) {
    uVar5 = lVar16 * 4;
  }
  __s_00 = (int *)operator_new__(uVar5);
  this->counts = __s_00;
  piVar7 = (int *)operator_new__(uVar5);
  this->tmp = piVar7;
  piVar7 = (int *)operator_new__(uVar5);
  this->best = piVar7;
  piVar7 = (int *)operator_new__(-(ulong)((ulong)pGVar10->n_vertices >> 0x3e != 0) |
                                 pGVar10->n_vertices << 2);
  this->dirty = piVar7;
  piVar8 = (int *)operator_new__(-(ulong)((ulong)pGVar10->n_vertices >> 0x3e != 0) |
                                 pGVar10->n_vertices << 2);
  this->unstable = piVar8;
  uVar5 = pGVar10->n_vertices;
  if (0 < (long)(lVar16 * uVar5)) {
    memset(piVar6,0,lVar16 * uVar5 * 4);
  }
  if (0 < (long)uVar5) {
    memset(__s,0xff,uVar5 * 4);
  }
  if (0 < iVar13) {
    uVar11 = 1;
    if (1 < (int)uVar15) {
      uVar11 = (ulong)uVar15;
    }
    memset(__s_00,0,uVar11 * 4 + 4);
  }
  if (0 < (long)uVar5) {
    puVar1 = ((this->super_Solver).disabled)->_bits;
    uVar11 = 0;
    do {
      if ((puVar1[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
        __s_00[pGVar10->_priority[uVar11]] = __s_00[pGVar10->_priority[uVar11]] + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  if (0 < (long)uVar5) {
    memset(piVar7,0,uVar5 * 4);
  }
  uVar15 = (int)uVar5 - 1;
  this->lift_attempt = 0;
  this->lift_count = 0;
  if (-1 < (int)uVar15) {
    uVar5 = (ulong)uVar15;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) {
        bVar3 = lift(this,(int)uVar5,-1);
        if (bVar3) {
          pGVar10 = (this->super_Solver).game;
          piVar6 = pGVar10->_inedges;
          lVar12 = (long)pGVar10->_firstins[uVar5];
          iVar13 = piVar6[lVar12];
          if (iVar13 != -1) {
            piVar6 = piVar6 + lVar12 + 1;
            do {
              if ((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar13 >> 6] >>
                   ((long)iVar13 & 0x3fU) & 1) == 0) {
                bVar3 = lift(this,iVar13,(int)uVar5);
                if (bVar3) {
                  todo_push(this,iVar13);
                }
              }
              iVar13 = *piVar6;
              piVar6 = piVar6 + 1;
            } while (iVar13 != -1);
          }
        }
      }
      bVar3 = 0 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
  }
  poVar9 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"main loop now",0xd);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    lVar12 = 0;
    do {
      iVar4 = todo_pop(this);
      pGVar10 = (this->super_Solver).game;
      piVar6 = pGVar10->_inedges;
      lVar16 = (long)pGVar10->_firstins[iVar4];
      iVar13 = piVar6[lVar16];
      if (iVar13 != -1) {
        piVar6 = piVar6 + lVar16 + 1;
        do {
          if ((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar13 >> 6] >>
               ((long)iVar13 & 0x3fU) & 1) == 0) {
            bVar3 = lift(this,iVar13,iVar4);
            if (bVar3) {
              todo_push(this,iVar13);
            }
          }
          iVar13 = *piVar6;
          piVar6 = piVar6 + 1;
        } while (iVar13 != -1);
      }
      lVar16 = this->lift_count;
      if (lVar12 + ((this->super_Solver).game)->n_vertices * 10 < lVar16) {
        update(this,0);
        update(this,1);
        lVar12 = lVar16;
      }
    } while ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  if ((1 < (this->super_Solver).trace) && (0 < ((this->super_Solver).game)->n_vertices)) {
    uVar5 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\x1b[35m**\x1b[m \x1b[1mnode ",0x14);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
        poVar9 = (ostream *)
                 std::ostream::operator<<(poVar9,((this->super_Solver).game)->_priority[uVar5]);
        bVar3 = ((((this->super_Solver).game)->_owner)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0
        ;
        pcVar14 = " (odd)";
        if (!bVar3) {
          pcVar14 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,7 - (ulong)bVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m is",6);
        pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar5);
        poVar9 = (this->super_Solver).logger;
        cVar2 = (char)poVar9;
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < ((this->super_Solver).game)->n_vertices);
  }
  pGVar10 = (this->super_Solver).game;
  if (0 < pGVar10->n_vertices) {
    uVar5 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) {
        lVar12 = this->k * uVar5;
        iVar13 = this->pms[lVar12];
        if ((iVar13 == -1) != (this->pms[lVar12 + 1] != -1)) {
          this_00 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_00,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/tspm.cpp"
                       ,0x1a1);
          __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
        }
        iVar4 = -1;
        if ((((pGVar10->_owner)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) == (iVar13 != -1)) {
          iVar4 = this->strategy[uVar5];
        }
        Oink::solve((this->super_Solver).oink,(int)uVar5,(uint)(iVar13 != -1),iVar4);
      }
      uVar5 = uVar5 + 1;
      pGVar10 = (this->super_Solver).game;
    } while ((long)uVar5 < pGVar10->n_vertices);
  }
  if (this->pms != (int *)0x0) {
    operator_delete__(this->pms);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->counts != (int *)0x0) {
    operator_delete__(this->counts);
  }
  if (this->tmp != (int *)0x0) {
    operator_delete__(this->tmp);
  }
  if (this->best != (int *)0x0) {
    operator_delete__(this->best);
  }
  if (this->dirty != (int *)0x0) {
    operator_delete__(this->dirty);
  }
  if (this->unstable != (int *)0x0) {
    operator_delete__(this->unstable);
  }
  poVar9 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"solved with ",0xc);
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," lifts, ",8);
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," lift attempts.",0xf);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return;
}

Assistant:

void
TSPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;
    if (k < 2) k = 2;

    // now create the data structure, for each node
    pms = new int[(size_t)k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    tmp = new int[k];
    best = new int[k];
    dirty = new int[nodecount()];
    unstable = new int[nodecount()];

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (disabled[i] == 0) counts[priority(i)]++;

    // initialize all nodes as not dirty
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue/stack to store the dirty vertices.
     */

    /**
     * Initialization loop.
     */

    for (int n=nodecount()-1; n>=0; n--) {
        if (!disabled[n] and lift(n, -1)) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
        }
    }
    
    /**
     * The main loop.
     */

    logger << "main loop now" << std::endl;
    int64_t last_update = 0;

    while (!todo.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (!disabled[from] and lift(from, n)) todo_push(from);
        }
        if (last_update + 10*nodecount() < lift_count) {
            last_update = lift_count;
            update(0);
            update(1);
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int n=0; n<nodecount(); n++) {
            if (disabled[n]) continue;
            logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            logger << std::endl;
        }
    }
#endif
    
    // Now set dominions and derive strategy for even.
    for (int n=0; n<nodecount(); n++) {
        if (disabled[n]) continue;
        int *pm = pms + k*n;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(n, winner, owner(n) == winner ? strategy[n] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] tmp;
    delete[] best;
    delete[] dirty;
    delete[] unstable;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}